

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O3

void testEraseAttribute(string *name)

{
  long lVar1;
  long lVar2;
  Header header;
  undefined8 local_50;
  Header local_48 [56];
  
  local_50 = 0;
  Imf_3_4::Header::Header(local_48,0x40,0x40,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  lVar1 = Imf_3_4::Header::find((string *)local_48);
  lVar2 = Imf_3_4::Header::end();
  if (lVar1 == lVar2) {
    __assert_fail("header.find (name) != header.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                  ,0x41,"void testEraseAttribute(const string &)");
  }
  Imf_3_4::Header::erase((string *)local_48);
  lVar1 = Imf_3_4::Header::find((string *)local_48);
  lVar2 = Imf_3_4::Header::end();
  if (lVar1 == lVar2) {
    Imf_3_4::Header::~Header(local_48);
    return;
  }
  __assert_fail("header.find (name) == header.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x43,"void testEraseAttribute(const string &)");
}

Assistant:

void
testEraseAttribute (const string& name)
{
    Header header;
    assert (header.find (name) != header.end ());
    header.erase (name);
    assert (header.find (name) == header.end ());
}